

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

void prometheus::Gateway::CleanupStalePointers
               (vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *collectables)

{
  __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_48;
  const_iterator local_40;
  pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_20;
  const_iterator local_18;
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *collectables_local;
  
  local_10 = collectables;
  local_28 = (pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)::std::
                begin<std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
                          (collectables);
  local_30 = (pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)::std::
                end<std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
                          (local_10);
  local_20 = ::std::
             remove_if<__gnu_cxx::__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>*,std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>,prometheus::Gateway::CleanupStalePointers(std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>&)::__0>
                       (local_28,local_30);
  __gnu_cxx::
  __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>const*,std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
  ::__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>*>
            ((__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>const*,std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
              *)&local_18,&local_20);
  local_48._M_current =
       (pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)::std::
          end<std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
                    (local_10);
  __gnu_cxx::
  __normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>const*,std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
  ::__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>*>
            ((__normal_iterator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>const*,std::vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>>
              *)&local_40,&local_48);
  ::std::
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(collectables,local_18,local_40);
  return;
}

Assistant:

void Gateway::CleanupStalePointers(
    std::vector<CollectableEntry>& collectables) {
  collectables.erase(
      std::remove_if(std::begin(collectables), std::end(collectables),
                     [](const CollectableEntry& candidate) {
                       return candidate.first.expired();
                     }),
      std::end(collectables));
}